

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra86.c
# Opt level: O0

SizeT x86_Convert(Byte *data,SizeT size,UInt32 ip,UInt32 *state,int encoding)

{
  int iVar1;
  int iVar2;
  Byte *pBVar3;
  sbyte sVar4;
  uint local_68;
  uint sh;
  UInt32 cur;
  UInt32 v;
  SizeT d;
  Byte *limit;
  Byte *p;
  UInt32 mask;
  SizeT pos;
  int encoding_local;
  UInt32 *state_local;
  UInt32 ip_local;
  SizeT size_local;
  Byte *data_local;
  SizeT local_8;
  
  pos = 0;
  mask = *state & 7;
  if (size < 5) {
    local_8 = 0;
  }
  else {
    while( true ) {
      for (p = data + pos; (p < data + (size - 4) && ((*p & 0xfe) != 0xe8)); p = p + 1) {
      }
      pBVar3 = p + (-pos - (long)data);
      local_8 = (long)p - (long)data;
      if (data + (size - 4) <= p) break;
      if (pBVar3 < (Byte *)0x3) {
        mask = mask >> ((byte)pBVar3 & 0x1f);
        if ((mask == 0) || (((mask < 5 && (mask != 3)) && ((p[(mask >> 1) + 1] + 1 & 0xfe) != 0))))
        goto LAB_009f1129;
        mask = mask >> 1 | 4;
        pos = local_8 + 1;
      }
      else {
        mask = 0;
LAB_009f1129:
        if ((p[4] + 1 & 0xfe) == 0) {
          iVar2 = ip + 5 + (int)local_8;
          pos = local_8 + 5;
          iVar1 = iVar2;
          if (encoding == 0) {
            iVar1 = -iVar2;
          }
          v = iVar1 + ((uint)p[4] << 0x18 | (uint)p[3] << 0x10 | (uint)p[2] << 8 | (uint)p[1]);
          if (mask != 0) {
            sVar4 = (sbyte)((mask & 6) << 2);
            if (((v >> sVar4 & 0xff) + 1 & 0xfe) == 0) {
              if (encoding == 0) {
                iVar2 = -iVar2;
              }
              v = iVar2 + ((0x100 << sVar4) - 1U ^ v);
            }
            mask = 0;
          }
          p[1] = (Byte)v;
          p[2] = (Byte)(v >> 8);
          p[3] = (Byte)(v >> 0x10);
          p[4] = -((byte)(v >> 0x18) & 1);
        }
        else {
          mask = mask >> 1 | 4;
          pos = local_8 + 1;
        }
      }
    }
    if (pBVar3 < (Byte *)0x3) {
      local_68 = mask >> ((byte)pBVar3 & 0x1f);
    }
    else {
      local_68 = 0;
    }
    *state = local_68;
  }
  return local_8;
}

Assistant:

SizeT x86_Convert(Byte *data, SizeT size, UInt32 ip, UInt32 *state, int encoding)
{
  SizeT pos = 0;
  UInt32 mask = *state & 7;
  if (size < 5)
    return 0;
  size -= 4;
  ip += 5;

  for (;;)
  {
    Byte *p = data + pos;
    const Byte *limit = data + size;
    for (; p < limit; p++)
      if ((*p & 0xFE) == 0xE8)
        break;

    {
      SizeT d = (SizeT)(p - data - pos);
      pos = (SizeT)(p - data);
      if (p >= limit)
      {
        *state = (d > 2 ? 0 : mask >> (unsigned)d);
        return pos;
      }
      if (d > 2)
        mask = 0;
      else
      {
        mask >>= (unsigned)d;
        if (mask != 0 && (mask > 4 || mask == 3 || Test86MSByte(p[(mask >> 1) + 1])))
        {
          mask = (mask >> 1) | 4;
          pos++;
          continue;
        }
      }
    }

    if (Test86MSByte(p[4]))
    {
      UInt32 v = ((UInt32)p[4] << 24) | ((UInt32)p[3] << 16) | ((UInt32)p[2] << 8) | ((UInt32)p[1]);
      UInt32 cur = ip + (UInt32)pos;
      pos += 5;
      if (encoding)
        v += cur;
      else
        v -= cur;
      if (mask != 0)
      {
        unsigned sh = (mask & 6) << 2;
        if (Test86MSByte((Byte)(v >> sh)))
        {
          v ^= (((UInt32)0x100 << sh) - 1);
          if (encoding)
            v += cur;
          else
            v -= cur;
        }
        mask = 0;
      }
      p[1] = (Byte)v;
      p[2] = (Byte)(v >> 8);
      p[3] = (Byte)(v >> 16);
      p[4] = (Byte)(0 - ((v >> 24) & 1));
    }
    else
    {
      mask = (mask >> 1) | 4;
      pos++;
    }
  }
}